

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O0

void __thiscall
shared_data::print_update
          (shared_data *this,bool holdout_set_off,size_t current_pass,string *label,
          uint32_t prediction,size_t num_features,bool progress_add,float progress_arg)

{
  ostream *poVar1;
  undefined8 uVar2;
  uint in_R8D;
  ostringstream pred_buf;
  string local_1e8 [35];
  char local_1c5;
  int local_1b4;
  ostringstream local_1b0 [48];
  float in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  size_t in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffe98;
  size_t in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffeaf;
  shared_data *in_stack_fffffffffffffeb0;
  
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  local_1b4 = (int)std::setw(8);
  poVar1 = std::operator<<((ostream *)local_1b0,(_Setw)local_1b4);
  uVar2 = std::ostream::operator<<(poVar1,std::right);
  local_1c5 = (char)std::setfill<char>(' ');
  poVar1 = std::operator<<(uVar2,local_1c5);
  std::ostream::operator<<(poVar1,in_R8D);
  std::__cxx11::ostringstream::str();
  print_update(in_stack_fffffffffffffeb0,(bool)in_stack_fffffffffffffeaf,in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (bool)in_stack_fffffffffffffe87,in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return;
}

Assistant:

void print_update(bool holdout_set_off, size_t current_pass, const std::string& label, uint32_t prediction,
      size_t num_features, bool progress_add, float progress_arg)
  {
    std::ostringstream pred_buf;

    pred_buf << std::setw(col_current_predict) << std::right << std::setfill(' ') << prediction;

    print_update(holdout_set_off, current_pass, label, pred_buf.str(), num_features, progress_add, progress_arg);
  }